

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_expr.cpp
# Opt level: O1

double nivalis::detail::eval_ast
                 (Environment *env,AST *ast,vector<double,_std::allocator<double>_> *arg_vals)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  undefined8 uVar4;
  pointer pAVar5;
  pointer pAVar6;
  pointer pUVar7;
  iterator iVar8;
  double dVar9;
  bool bVar10;
  uint64_t uVar11;
  long lVar12;
  unsigned_long uVar13;
  unsigned_long uVar14;
  long lVar15;
  Environment *pEVar16;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *ppVar17;
  lanczos17m64 *t;
  double *pdVar18;
  unsigned_long uVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  long *in_FS_OFFSET;
  bool bVar24;
  longdouble in_ST0;
  longdouble lVar25;
  longdouble lVar26;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble lVar27;
  longdouble in_ST4;
  longdouble lVar28;
  longdouble in_ST5;
  longdouble lVar29;
  longdouble in_ST6;
  longdouble lVar30;
  ulong uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  uint uVar34;
  vector<double,_std::allocator<double>_> f_args;
  allocator_type local_a9;
  unsigned_long local_a8;
  ulong local_a0;
  vector<double,_std::allocator<double>_> local_98;
  Environment *local_80;
  double local_78;
  double local_70;
  long local_68;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_60;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_58;
  Environment *local_50;
  double local_48;
  double local_40;
  ulong local_38;
  
  local_80 = env;
  local_50 = (Environment *)arg_vals;
  if ((char)in_FS_OFFSET[-10] == '\0') {
    eval_ast();
  }
  if ((char)in_FS_OFFSET[-6] == '\0') {
    eval_ast();
  }
  if ((char)in_FS_OFFSET[-2] == '\0') {
    eval_ast();
  }
  lVar15 = in_FS_OFFSET[-0x16];
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
             ((long)(ast->
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(ast->
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4) + lVar15 + 1);
  pAVar5 = (ast->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pAVar6 = (ast->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_a8 = (long)pAVar5 - (long)pAVar6 >> 4;
  bVar24 = pAVar5 == pAVar6;
  if (!bVar24) {
    local_58 = (vector<unsigned_long,std::allocator<unsigned_long>> *)(*in_FS_OFFSET + -0x28);
    local_60 = (vector<unsigned_long,std::allocator<unsigned_long>> *)(*in_FS_OFFSET + -0x48);
    local_a0 = 0;
    local_70 = NAN;
    local_68 = lVar15;
    do {
      local_a8 = local_a8 - 1;
      pAVar5 = (ast->
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar34 = pAVar5[local_a8].opcode;
      ppVar17 = (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                 *)(ulong)uVar34;
      bVar10 = true;
      if ((int)uVar34 < 0x50) {
        if (0x1f < (int)uVar34) {
          if ((int)uVar34 < 0x31) {
            if (uVar34 == 0x20) {
              lVar12 = in_FS_OFFSET[-0x16];
              lVar22 = in_FS_OFFSET[-0xd];
              lVar15 = lVar12 + -1;
              dVar9 = *(double *)(lVar22 + lVar12 * 8) + *(double *)(lVar22 + -8 + lVar12 * 8);
            }
            else if (uVar34 == 0x21) {
              lVar12 = in_FS_OFFSET[-0x16];
              lVar22 = in_FS_OFFSET[-0xd];
              lVar15 = lVar12 + -1;
              dVar9 = *(double *)(lVar22 + lVar12 * 8) - *(double *)(lVar22 + -8 + lVar12 * 8);
            }
            else {
              if (uVar34 != 0x30) goto switchD_001163b4_caseD_4;
              lVar12 = in_FS_OFFSET[-0x16];
              lVar22 = in_FS_OFFSET[-0xd];
              lVar15 = lVar12 + -1;
              dVar9 = *(double *)(lVar22 + lVar12 * 8) * *(double *)(lVar22 + -8 + lVar12 * 8);
            }
            goto LAB_00116b05;
          }
          if ((int)uVar34 < 0x40) {
            if (uVar34 == 0x31) {
              lVar12 = in_FS_OFFSET[-0x16];
              lVar22 = in_FS_OFFSET[-0xd];
              lVar15 = lVar12 + -1;
              dVar9 = *(double *)(lVar22 + lVar12 * 8) / *(double *)(lVar22 + -8 + lVar12 * 8);
              goto LAB_00116b05;
            }
            if (uVar34 == 0x32) {
              dVar9 = fmod(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8),
                           *(double *)(in_FS_OFFSET[-0xd] + -8 + in_FS_OFFSET[-0x16] * 8));
              goto LAB_00117163;
            }
          }
          else {
            if (uVar34 == 0x40) {
              dVar9 = pow(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8),
                          *(double *)(in_FS_OFFSET[-0xd] + -8 + in_FS_OFFSET[-0x16] * 8));
              goto LAB_00117163;
            }
            if (uVar34 == 0x41) {
              local_78 = log(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
              dVar9 = log(*(double *)(in_FS_OFFSET[-0xd] + -8 + in_FS_OFFSET[-0x16] * 8));
              goto LAB_001171d2;
            }
          }
          goto switchD_001163b4_caseD_4;
        }
        switch(uVar34) {
        case 0:
          lVar15 = in_FS_OFFSET[-0x16];
          in_FS_OFFSET[-0x16] = lVar15 + 1;
          *(undefined8 *)(in_FS_OFFSET[-0xd] + 8 + lVar15 * 8) = 0x7ff8000000000000;
          break;
        case 1:
          uVar32 = (undefined4)pAVar5[local_a8].field_1.ref;
          uVar33 = (undefined4)(pAVar5[local_a8].field_1.ref >> 0x20);
          goto LAB_001166c5;
        case 2:
          uVar11 = pAVar5[local_a8].field_1.ref;
          pEVar16 = local_80;
          goto LAB_001166bd;
        case 3:
          uVar11 = pAVar5[local_a8].field_1.ref;
          pEVar16 = local_50;
LAB_001166bd:
          dVar9 = (pEVar16->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar11];
          uVar32 = SUB84(dVar9,0);
          uVar33 = (undefined4)((ulong)dVar9 >> 0x20);
LAB_001166c5:
          lVar15 = in_FS_OFFSET[-0x16];
          in_FS_OFFSET[-0x16] = lVar15 + 1;
          *(ulong *)(in_FS_OFFSET[-0xd] + 8 + lVar15 * 8) = CONCAT44(uVar33,uVar32);
          break;
        case 8:
          lVar15 = in_FS_OFFSET[-4] + -8;
          local_a8 = *(long *)(in_FS_OFFSET[-4] + -8) + 1;
          in_FS_OFFSET[-4] = lVar15;
          bVar10 = true;
          local_a0 = CONCAT71((int7)((ulong)lVar15 >> 8),1);
          break;
        case 9:
          iVar8._M_current = (unsigned_long *)in_FS_OFFSET[-8];
          if (iVar8._M_current == (unsigned_long *)in_FS_OFFSET[-7]) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>(local_60,iVar8,&local_a8);
          }
          else {
            *iVar8._M_current = local_a8;
            in_FS_OFFSET[-8] = (long)(iVar8._M_current + 1);
          }
          local_a8 = local_a8 -
                     (ast->
                     super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                     )._M_impl.super__Vector_impl_data._M_start[local_a8].field_1.ref;
          break;
        case 0xc:
          uVar34 = pAVar5[local_a8].field_1.call_info[0];
          uVar31 = (ulong)pAVar5[local_a8].field_1.call_info[1];
          pUVar7 = (local_80->funcs).
                   super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::vector<double,_std::allocator<double>_>::vector(&local_98,uVar31,&local_a9);
          if (uVar31 != 0) {
            lVar15 = in_FS_OFFSET[-0x16];
            pdVar18 = (double *)(lVar15 * 8 + in_FS_OFFSET[-0xd]);
            uVar20 = 0;
            do {
              local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar20] = *pdVar18;
              uVar20 = uVar20 + 1;
              pdVar18 = pdVar18 + -1;
            } while (uVar31 != uVar20);
            in_FS_OFFSET[-0x16] = lVar15 - uVar20;
          }
          if ((pUVar7[uVar34].n_args == uVar31) &&
             ((ulong)in_FS_OFFSET[-1] < 0x101 &&
              *(pointer *)
               &pUVar7[uVar34].expr.ast.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl !=
              (ast->
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
              _M_impl.super__Vector_impl_data._M_start)) {
            in_FS_OFFSET[-1] = in_FS_OFFSET[-1] + 1;
            eval_ast(local_80,&pUVar7[uVar34].expr.ast,&local_98);
            in_FS_OFFSET[-1] = in_FS_OFFSET[-1] + -1;
            lVar15 = in_FS_OFFSET[-0x16] + 1;
            bVar10 = true;
          }
          else {
            bVar10 = false;
            lVar15 = local_68;
          }
          in_FS_OFFSET[-0x16] = lVar15;
          if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_98.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_98.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          break;
        case 0x10:
          if ((local_a0 & 1) == 0) {
            iVar8._M_current = (unsigned_long *)in_FS_OFFSET[-4];
            if (iVar8._M_current == (unsigned_long *)in_FS_OFFSET[-3]) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>(local_58,iVar8,&local_a8);
            }
            else {
              *iVar8._M_current = local_a8;
              in_FS_OFFSET[-4] = (long)(iVar8._M_current + 1);
            }
            local_a8 = *(unsigned_long *)
                        (in_FS_OFFSET[-8] + -8 +
                        (ulong)(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8) == 0.0) *
                        -8);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_60,
                       (in_FS_OFFSET[-8] - in_FS_OFFSET[-9] >> 3) - 2);
          }
          else {
            lVar15 = in_FS_OFFSET[-0x16];
            in_FS_OFFSET[-0x16] = lVar15 + -1;
            *(undefined8 *)(in_FS_OFFSET[-0xd] + -8 + lVar15 * 8) =
                 *(undefined8 *)(in_FS_OFFSET[-0xd] + lVar15 * 8);
            local_a0 = 0;
          }
          break;
        case 0x11:
        case 0x12:
          lVar15 = in_FS_OFFSET[-0x16];
          if ((local_a0 & 1) == 0) {
            in_FS_OFFSET[-0x16] = lVar15 + 1;
            lVar12 = in_FS_OFFSET[-0xd];
            puVar2 = (undefined8 *)(lVar12 + -8 + lVar15 * 8);
            uVar4 = puVar2[1];
            puVar1 = (undefined8 *)(lVar12 + lVar15 * 8);
            *puVar1 = *puVar2;
            puVar1[1] = uVar4;
            uVar21 = 0x3ff00000;
            if (uVar34 != 0x12) {
              uVar21 = 0;
            }
            *(ulong *)(lVar12 + -8 + lVar15 * 8) = (ulong)uVar21 << 0x20;
          }
          else {
            in_FS_OFFSET[-0x16] = lVar15 + -1;
            lVar12 = in_FS_OFFSET[-0xd];
            dVar9 = *(double *)(lVar12 + -0x18 + lVar15 * 8);
            dVar3 = *(double *)(lVar12 + lVar15 * 8);
            if (uVar34 == 0x12) {
              dVar3 = dVar3 * dVar9;
            }
            else {
              dVar3 = dVar3 + dVar9;
            }
            *(double *)(lVar12 + -0x18 + lVar15 * 8) = dVar3;
            local_a0 = 0;
          }
          lVar15 = in_FS_OFFSET[-0x16];
          lVar12 = in_FS_OFFSET[-0xd];
          dVar9 = *(double *)(lVar12 + lVar15 * 8);
          if (NAN(dVar9)) {
            in_FS_OFFSET[-0x16] = lVar15 + -2;
            in_FS_OFFSET[-8] = in_FS_OFFSET[-8] + -8;
          }
          else {
            lVar22 = (long)dVar9;
            lVar23 = (long)*(double *)(lVar12 + -8 + lVar15 * 8);
            (local_80->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[pAVar5[local_a8].field_1.ref] = (double)lVar22;
            dVar9 = local_70;
            if (lVar22 != lVar23) {
              dVar9 = (double)(long)(lVar22 + (ulong)(lVar22 <= lVar23) * 2 + -1);
            }
            *(double *)(lVar12 + lVar15 * 8) = dVar9;
            iVar8._M_current = (unsigned_long *)in_FS_OFFSET[-4];
            if (iVar8._M_current == (unsigned_long *)in_FS_OFFSET[-3]) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>(local_58,iVar8,&local_a8);
            }
            else {
              *iVar8._M_current = local_a8;
              in_FS_OFFSET[-4] = (long)(iVar8._M_current + 1);
            }
            local_a8 = *(unsigned_long *)(in_FS_OFFSET[-8] + -8);
          }
          break;
        case 0x18:
          in_FS_OFFSET[-0x16] = in_FS_OFFSET[-0x16] + -1;
        }
        goto switchD_001163b4_caseD_4;
      }
      lVar25 = in_ST1;
      lVar26 = in_ST2;
      lVar27 = in_ST3;
      lVar28 = in_ST4;
      lVar29 = in_ST5;
      lVar30 = in_ST6;
      switch(uVar34) {
      case 0x8000:
        lVar15 = in_FS_OFFSET[-0x16];
        lVar12 = in_FS_OFFSET[-0xd];
        uVar4 = *(undefined8 *)(lVar12 + lVar15 * 8);
        uVar34 = (uint)((ulong)uVar4 >> 0x20) ^ 0x80000000;
        uVar32 = (undefined4)uVar4;
        goto LAB_00116d87;
      case 0x8001:
        lVar15 = in_FS_OFFSET[-0x16];
        lVar12 = in_FS_OFFSET[-0xd];
        uVar34 = (uint)(-(ulong)(*(double *)(lVar12 + lVar15 * 8) == 0.0) >> 0x20) & 0x3ff00000;
        uVar32 = 0;
        goto LAB_00116d87;
      case 0x8002:
        lVar15 = in_FS_OFFSET[-0x16];
        lVar12 = in_FS_OFFSET[-0xd];
        uVar31 = *(ulong *)(lVar12 + lVar15 * 8) & 0x7fffffffffffffff;
        uVar32 = (undefined4)uVar31;
        uVar34 = (uint)(uVar31 >> 0x20);
LAB_00116d87:
        *(ulong *)(lVar12 + lVar15 * 8) = CONCAT44(uVar34,uVar32);
        goto switchD_001163b4_caseD_4;
      case 0x8003:
        dVar9 = *(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8);
        if (dVar9 < 0.0) {
          dVar9 = sqrt(dVar9);
          lVar25 = in_ST1;
          lVar26 = in_ST2;
          lVar27 = in_ST3;
          lVar28 = in_ST4;
          lVar29 = in_ST5;
          lVar30 = in_ST6;
        }
        else {
          dVar9 = SQRT(dVar9);
        }
        break;
      case 0x8004:
        lVar15 = in_FS_OFFSET[-0x16];
        lVar12 = in_FS_OFFSET[-0xd];
        dVar9 = *(double *)(lVar12 + lVar15 * 8);
        dVar9 = dVar9 * dVar9;
        goto LAB_001173aa;
      case 0x8005:
        dVar9 = *(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8);
        uVar31 = -(ulong)(0.0 < dVar9);
        *(ulong *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8) =
             uVar31 & 0x3ff0000000000000 |
             (ulong)(~(uint)(uVar31 >> 0x20) & (uint)(-(ulong)(dVar9 != 0.0) >> 0x20) & 0xbff00000)
             << 0x20;
        goto switchD_001163b4_caseD_4;
      case 0x8006:
        lVar15 = in_FS_OFFSET[-0x16];
        lVar12 = in_FS_OFFSET[-0xd];
        dVar9 = floor(*(double *)(lVar12 + lVar15 * 8));
        *(double *)(lVar12 + lVar15 * 8) = dVar9;
        goto switchD_001163b4_caseD_4;
      case 0x8007:
        lVar15 = in_FS_OFFSET[-0x16];
        lVar12 = in_FS_OFFSET[-0xd];
        dVar9 = ceil(*(double *)(lVar12 + lVar15 * 8));
        uVar32 = SUB84(dVar9,0);
        uVar33 = (undefined4)((ulong)dVar9 >> 0x20);
        goto LAB_00116f3e;
      case 0x8008:
        lVar15 = in_FS_OFFSET[-0x16];
        lVar12 = in_FS_OFFSET[-0xd];
        dVar9 = round(*(double *)(lVar12 + lVar15 * 8));
        uVar32 = SUB84(dVar9,0);
        uVar33 = (undefined4)((ulong)dVar9 >> 0x20);
LAB_00116f3e:
        *(ulong *)(lVar12 + lVar15 * 8) = CONCAT44(uVar33,uVar32);
        goto switchD_001163b4_caseD_4;
      case 0x8009:
        dVar9 = exp(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
        lVar25 = in_ST1;
        lVar26 = in_ST2;
        lVar27 = in_ST3;
        lVar28 = in_ST4;
        lVar29 = in_ST5;
        lVar30 = in_ST6;
        break;
      case 0x800a:
        dVar9 = exp2(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
        lVar25 = in_ST1;
        lVar26 = in_ST2;
        lVar27 = in_ST3;
        lVar28 = in_ST4;
        lVar29 = in_ST5;
        lVar30 = in_ST6;
        break;
      case 0x800b:
        dVar9 = *(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8);
LAB_00116dc7:
        dVar9 = log(dVar9);
        lVar25 = in_ST1;
        lVar26 = in_ST2;
        lVar27 = in_ST3;
        lVar28 = in_ST4;
        lVar29 = in_ST5;
        lVar30 = in_ST6;
        break;
      case 0x800c:
        dVar9 = log10(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
        lVar25 = in_ST1;
        lVar26 = in_ST2;
        lVar27 = in_ST3;
        lVar28 = in_ST4;
        lVar29 = in_ST5;
        lVar30 = in_ST6;
        break;
      case 0x800d:
        dVar9 = log2(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
        lVar25 = in_ST1;
        lVar26 = in_ST2;
        lVar27 = in_ST3;
        lVar28 = in_ST4;
        lVar29 = in_ST5;
        lVar30 = in_ST6;
        break;
      case 0x800e:
        uVar32 = 0;
        uVar33 = 0;
        dVar9 = *(double *)((lanczos17m64 *)in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8);
        if (0.0 <= dVar9) {
          uVar32 = SUB84(dVar9,0);
          uVar33 = (undefined4)((ulong)dVar9 >> 0x20);
        }
        uVar34 = (uint)(long)(double)CONCAT44(uVar33,uVar32);
        if (uVar34 < 0xab) {
          dVar9 = (double)*(longdouble *)
                           (&DAT_00126a00 +
                           ((long)(double)CONCAT44(uVar33,uVar32) & 0xffffffffU) * 0x10);
          local_48 = dVar9;
        }
        else {
          local_38 = (ulong)(uVar34 + 1);
          boost::math::detail::
          gamma_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>,boost::math::lanczos::lanczos17m64>
                    ((longdouble *)&local_98,(detail *)&local_a9,(longdouble)local_38,ppVar17,
                     (lanczos17m64 *)in_FS_OFFSET[-0xd]);
          dVar9 = (double)in_ST0;
          in_ST0 = in_ST1;
          lVar25 = in_ST2;
          lVar26 = in_ST3;
          lVar27 = in_ST4;
          lVar28 = in_ST5;
          lVar29 = in_ST6;
          local_40 = dVar9;
          if (dVar9 <= 1.79769313486232e+308) {
            dVar9 = floor(dVar9 + 0.5);
            in_ST0 = in_ST1;
            lVar25 = in_ST2;
            lVar26 = in_ST3;
            lVar27 = in_ST4;
            lVar28 = in_ST5;
            lVar29 = in_ST6;
          }
        }
        break;
      case 0x800f:
        dVar9 = sin(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
        lVar25 = in_ST1;
        lVar26 = in_ST2;
        lVar27 = in_ST3;
        lVar28 = in_ST4;
        lVar29 = in_ST5;
        lVar30 = in_ST6;
        break;
      case 0x8010:
        dVar9 = cos(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
        lVar25 = in_ST1;
        lVar26 = in_ST2;
        lVar27 = in_ST3;
        lVar28 = in_ST4;
        lVar29 = in_ST5;
        lVar30 = in_ST6;
        break;
      case 0x8011:
        dVar9 = tan(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
        lVar25 = in_ST1;
        lVar26 = in_ST2;
        lVar27 = in_ST3;
        lVar28 = in_ST4;
        lVar29 = in_ST5;
        lVar30 = in_ST6;
        break;
      case 0x8012:
        dVar9 = asin(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
        lVar25 = in_ST1;
        lVar26 = in_ST2;
        lVar27 = in_ST3;
        lVar28 = in_ST4;
        lVar29 = in_ST5;
        lVar30 = in_ST6;
        break;
      case 0x8013:
        dVar9 = acos(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
        lVar25 = in_ST1;
        lVar26 = in_ST2;
        lVar27 = in_ST3;
        lVar28 = in_ST4;
        lVar29 = in_ST5;
        lVar30 = in_ST6;
        break;
      case 0x8014:
        dVar9 = atan(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
        lVar25 = in_ST1;
        lVar26 = in_ST2;
        lVar27 = in_ST3;
        lVar28 = in_ST4;
        lVar29 = in_ST5;
        lVar30 = in_ST6;
        break;
      case 0x8015:
        dVar9 = sinh(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
        lVar25 = in_ST1;
        lVar26 = in_ST2;
        lVar27 = in_ST3;
        lVar28 = in_ST4;
        lVar29 = in_ST5;
        lVar30 = in_ST6;
        break;
      case 0x8016:
        dVar9 = cosh(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
        lVar25 = in_ST1;
        lVar26 = in_ST2;
        lVar27 = in_ST3;
        lVar28 = in_ST4;
        lVar29 = in_ST5;
        lVar30 = in_ST6;
        break;
      case 0x8017:
        dVar9 = tanh(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
        lVar25 = in_ST1;
        lVar26 = in_ST2;
        lVar27 = in_ST3;
        lVar28 = in_ST4;
        lVar29 = in_ST5;
        lVar30 = in_ST6;
        break;
      case 0x8018:
        dVar9 = tgamma(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
        lVar25 = in_ST1;
        lVar26 = in_ST2;
        lVar27 = in_ST3;
        lVar28 = in_ST4;
        lVar29 = in_ST5;
        lVar30 = in_ST6;
        break;
      case 0x8019:
        dVar9 = lgamma(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
        lVar25 = in_ST1;
        lVar26 = in_ST2;
        lVar27 = in_ST3;
        lVar28 = in_ST4;
        lVar29 = in_ST5;
        lVar30 = in_ST6;
        break;
      case 0x801a:
        lVar26 = in_ST6;
        boost::math::detail::
        digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                  ((longdouble *)0x0,(detail *)&local_98,
                   (longdouble)
                   *(double *)
                    ((policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                      *)in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8),
                   (integral_constant<int,_53> *)ppVar17,
                   (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                    *)in_FS_OFFSET[-0xd]);
        lVar25 = in_ST0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = lVar26;
        goto LAB_001170b6;
      case 0x801b:
        lVar26 = in_ST6;
        boost::math::detail::
        trigamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                  ((longdouble *)0x0,(detail *)&local_98,
                   (longdouble)
                   *(double *)
                    ((policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                      *)in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8),
                   (integral_constant<int,_53> *)ppVar17,
                   (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                    *)in_FS_OFFSET[-0xd]);
        lVar25 = in_ST0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = lVar26;
        goto LAB_001170b6;
      case 0x801c:
        dVar9 = erf(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
        lVar25 = in_ST1;
        lVar26 = in_ST2;
        lVar27 = in_ST3;
        lVar28 = in_ST4;
        lVar29 = in_ST5;
        lVar30 = in_ST6;
        break;
      case 0x801d:
        lVar25 = (longdouble)
                 *(double *)
                  ((integral_constant<int,_53> *)in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8);
        lVar26 = in_ST5;
        in_ST6 = in_ST5;
        boost::math::detail::
        zeta_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>,boost::integral_constant<int,53>>
                  ((longdouble *)&local_98,(detail *)&local_a9,lVar25,(longdouble)1 - lVar25,ppVar17
                   ,(integral_constant<int,_53> *)in_FS_OFFSET[-0xd]);
        lVar25 = in_ST0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = lVar26;
LAB_001170b6:
        *(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8) = (double)lVar25;
        goto switchD_001163b4_caseD_4;
      case 0x801e:
        dVar9 = exp(-*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
        *(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8) = 1.0 / (dVar9 + 1.0);
        goto switchD_001163b4_caseD_4;
      case 0x801f:
        dVar9 = *(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8);
        if (dVar9 < 15.0) {
          dVar9 = exp(dVar9);
          dVar9 = dVar9 + 1.0;
          goto LAB_00116dc7;
        }
        goto switchD_001163b4_caseD_4;
      case 0x8020:
        dVar9 = *(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8);
        dVar9 = exp(dVar9 * dVar9 * -0.5);
        dVar9 = dVar9 * 0.3989422804014327;
        lVar25 = in_ST1;
        lVar26 = in_ST2;
        lVar27 = in_ST3;
        lVar28 = in_ST4;
        lVar29 = in_ST5;
        lVar30 = in_ST6;
        break;
      default:
        switch(uVar34) {
        case 0x50:
          lVar12 = in_FS_OFFSET[-0x16];
          lVar22 = in_FS_OFFSET[-0xd];
          lVar15 = lVar12 + -1;
          dVar9 = *(double *)(lVar22 + -8 + lVar12 * 8);
          uVar32 = SUB84(dVar9,0);
          uVar33 = (undefined4)((ulong)dVar9 >> 0x20);
          dVar3 = *(double *)(lVar22 + lVar12 * 8);
          if (dVar9 <= dVar3) {
            uVar32 = SUB84(dVar3,0);
            uVar33 = (undefined4)((ulong)dVar3 >> 0x20);
          }
          dVar9 = (double)CONCAT44(uVar33,uVar32);
          goto LAB_00116b05;
        case 0x51:
          lVar12 = in_FS_OFFSET[-0x16];
          lVar22 = in_FS_OFFSET[-0xd];
          lVar15 = lVar12 + -1;
          dVar9 = *(double *)(lVar22 + -8 + lVar12 * 8);
          dVar3 = *(double *)(lVar22 + lVar12 * 8);
          if (dVar3 <= dVar9) {
            dVar9 = dVar3;
          }
          goto LAB_00116b05;
        case 0x52:
          lVar15 = in_FS_OFFSET[-0x16];
          lVar12 = in_FS_OFFSET[-0xd];
          dVar3 = *(double *)(lVar12 + lVar15 * 8);
          dVar9 = 0.0;
          if ((dVar3 != 0.0) || (NAN(dVar3))) {
LAB_00116a81:
            dVar9 = (double)(-(ulong)(*(double *)(lVar12 + -8 + lVar15 * 8) != 0.0) &
                            0x3ff0000000000000);
          }
          goto LAB_00117175;
        case 0x53:
          lVar15 = in_FS_OFFSET[-0x16];
          lVar12 = in_FS_OFFSET[-0xd];
          dVar3 = *(double *)(lVar12 + lVar15 * 8);
          dVar9 = 1.0;
          if ((dVar3 == 0.0) && (dVar9 = 1.0, !NAN(dVar3))) goto LAB_00116a81;
          goto LAB_00117175;
        case 0x54:
          lVar12 = in_FS_OFFSET[-0x16];
          lVar22 = in_FS_OFFSET[-0xd];
          lVar15 = lVar12 + -1;
          dVar9 = (double)((*(double *)(lVar22 + -8 + lVar12 * 8) != 0.0) !=
                          (*(double *)(lVar22 + lVar12 * 8) != 0.0));
LAB_00116b05:
          *(double *)(lVar22 + -8 + lVar12 * 8) = dVar9;
          goto LAB_00116b61;
        case 0x55:
        case 0x56:
        case 0x57:
        case 0x58:
        case 0x59:
        case 0x5a:
        case 0x5b:
        case 0x5c:
        case 0x5d:
        case 0x5e:
        case 0x5f:
          goto switchD_001163b4_caseD_4;
        case 0x60:
          lVar12 = in_FS_OFFSET[-0x16];
          lVar22 = in_FS_OFFSET[-0xd];
          uVar31 = -(ulong)(*(double *)(lVar22 + lVar12 * 8) < *(double *)(lVar22 + -8 + lVar12 * 8)
                           );
          break;
        case 0x61:
          lVar12 = in_FS_OFFSET[-0x16];
          lVar22 = in_FS_OFFSET[-0xd];
          uVar31 = -(ulong)(*(double *)(lVar22 + lVar12 * 8) <=
                           *(double *)(lVar22 + -8 + lVar12 * 8));
          break;
        case 0x62:
          lVar12 = in_FS_OFFSET[-0x16];
          lVar22 = in_FS_OFFSET[-0xd];
          uVar31 = -(ulong)(*(double *)(lVar22 + -8 + lVar12 * 8) ==
                           *(double *)(lVar22 + lVar12 * 8));
          break;
        case 99:
          lVar12 = in_FS_OFFSET[-0x16];
          lVar22 = in_FS_OFFSET[-0xd];
          uVar31 = -(ulong)(*(double *)(lVar22 + -8 + lVar12 * 8) !=
                           *(double *)(lVar22 + lVar12 * 8));
          break;
        case 100:
          lVar12 = in_FS_OFFSET[-0x16];
          lVar22 = in_FS_OFFSET[-0xd];
          uVar31 = -(ulong)(*(double *)(lVar22 + -8 + lVar12 * 8) <=
                           *(double *)(lVar22 + lVar12 * 8));
          break;
        case 0x65:
          lVar12 = in_FS_OFFSET[-0x16];
          lVar22 = in_FS_OFFSET[-0xd];
          uVar31 = -(ulong)(*(double *)(lVar22 + -8 + lVar12 * 8) < *(double *)(lVar22 + lVar12 * 8)
                           );
          break;
        default:
          t = (lanczos17m64 *)(ulong)(uVar34 - 0x4000);
          switch(t) {
          case (lanczos17m64 *)0x0:
            uVar19 = (unsigned_long)*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8);
            uVar13 = (unsigned_long)*(double *)(in_FS_OFFSET[-0xd] + -8 + in_FS_OFFSET[-0x16] * 8);
            uVar14 = -uVar19;
            if (0 < (long)uVar19) {
              uVar14 = uVar19;
            }
            uVar19 = -uVar13;
            if (0 < (long)uVar13) {
              uVar19 = uVar13;
            }
            uVar14 = std::__detail::__gcd<unsigned_long>(uVar14,uVar19);
            dVar9 = (double)(long)uVar14;
            break;
          case (lanczos17m64 *)0x1:
            local_78 = *(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8);
            uVar19 = (unsigned_long)local_78;
            dVar9 = *(double *)(in_FS_OFFSET[-0xd] + -8 + in_FS_OFFSET[-0x16] * 8);
            local_78 = local_78 * dVar9;
            uVar13 = (unsigned_long)dVar9;
            uVar14 = -uVar19;
            if (0 < (long)uVar19) {
              uVar14 = uVar19;
            }
            uVar19 = -uVar13;
            if (0 < (long)uVar13) {
              uVar19 = uVar13;
            }
            uVar14 = std::__detail::__gcd<unsigned_long>(uVar14,uVar19);
            dVar9 = (double)(long)uVar14;
LAB_001171d2:
            lVar15 = in_FS_OFFSET[-0x16];
            *(double *)(in_FS_OFFSET[-0xd] + -8 + lVar15 * 8) = local_78 / dVar9;
            goto LAB_001173e5;
          case (lanczos17m64 *)0x2:
            dVar9 = boost::math::
                    binomial_coefficient<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                              ((uint)(long)*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8)
                               ,(uint)(long)*(double *)
                                             (in_FS_OFFSET[-0xd] + -8 + in_FS_OFFSET[-0x16] * 8),
                               (policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                                *)&local_98);
            break;
          case (lanczos17m64 *)0x3:
            dVar9 = boost::math::detail::
                    falling_factorial_imp<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                              ((double)((long)*(double *)
                                               (in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8) &
                                       0xffffffff),
                               (uint)(long)*(double *)
                                            (in_FS_OFFSET[-0xd] + -8 + in_FS_OFFSET[-0x16] * 8),
                               (policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                                *)&local_98);
            break;
          case (lanczos17m64 *)0x4:
            dVar9 = boost::math::detail::
                    rising_factorial_imp<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                              ((double)((long)*(double *)
                                               (in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8) &
                                       0xffffffff),
                               (int)(long)*(double *)
                                           (in_FS_OFFSET[-0xd] + -8 + in_FS_OFFSET[-0x16] * 8),
                               (policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                                *)&local_98);
            break;
          case (lanczos17m64 *)0x5:
            ppVar17 = (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                       *)in_FS_OFFSET[-0xd];
            in_ST6 = in_ST5;
            lVar25 = in_ST5;
            boost::math::detail::
            beta_imp<long_double,boost::math::lanczos::lanczos17m64,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      ((longdouble *)&local_98,(detail *)&local_a9,
                       (longdouble)*(double *)(ppVar17 + in_FS_OFFSET[-0x16] * 8),
                       (longdouble)*(double *)(ppVar17 + in_FS_OFFSET[-0x16] * 8 + -8),t,ppVar17);
            goto LAB_001173cf;
          case (lanczos17m64 *)0x6:
            ppVar17 = (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                       *)in_FS_OFFSET[-0xd];
            uVar21 = (uint)*(double *)(ppVar17 + in_FS_OFFSET[-0x16] * 8);
            lVar26 = (longdouble)*(double *)(ppVar17 + in_FS_OFFSET[-0x16] * 8 + -8);
            lVar25 = in_ST6;
            if (uVar21 == 1) {
              boost::math::detail::
              trigamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                        ((longdouble *)0x0,(detail *)&local_98,lVar26,
                         (integral_constant<int,_53> *)t,ppVar17);
            }
            else if (uVar21 == 0) {
              boost::math::detail::
              digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                        ((longdouble *)0x0,(detail *)&local_98,lVar26,
                         (integral_constant<int,_53> *)t,ppVar17);
            }
            else {
              boost::math::detail::
              polygamma_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                        ((longdouble *)(ulong)uVar21,(detail *)&local_98,uVar34 - 0x4000,lVar26,
                         ppVar17);
            }
LAB_001173cf:
            lVar15 = in_FS_OFFSET[-0x16];
            *(double *)(in_FS_OFFSET[-0xd] + -8 + lVar15 * 8) = (double)in_ST0;
            in_ST0 = in_ST1;
            in_ST1 = in_ST2;
            in_ST2 = in_ST3;
            in_ST3 = in_ST4;
            in_ST4 = in_ST5;
            in_ST5 = in_ST6;
            in_ST6 = lVar25;
            goto LAB_001173e5;
          default:
            goto switchD_001163b4_caseD_4;
          }
LAB_00117163:
          lVar15 = in_FS_OFFSET[-0x16];
          lVar12 = in_FS_OFFSET[-0xd];
LAB_00117175:
          *(double *)(lVar12 + -8 + lVar15 * 8) = dVar9;
LAB_001173e5:
          in_FS_OFFSET[-0x16] = lVar15 + -1;
          goto switchD_001163b4_caseD_4;
        }
        lVar15 = lVar12 + -1;
        *(ulong *)(lVar22 + -8 + lVar12 * 8) = uVar31 & 0x3ff0000000000000;
LAB_00116b61:
        in_FS_OFFSET[-0x16] = lVar15;
        goto switchD_001163b4_caseD_4;
      }
      lVar15 = in_FS_OFFSET[-0x16];
      lVar12 = in_FS_OFFSET[-0xd];
      in_ST1 = lVar25;
      in_ST2 = lVar26;
      in_ST3 = lVar27;
      in_ST4 = lVar28;
      in_ST5 = lVar29;
      in_ST6 = lVar30;
LAB_001173aa:
      *(double *)(lVar12 + lVar15 * 8) = dVar9;
switchD_001163b4_caseD_4:
    } while ((bVar10) && (bVar24 = local_a8 == 0, !bVar24));
  }
  if (bVar24) {
    lVar15 = in_FS_OFFSET[-0x16];
    in_FS_OFFSET[-0x16] = lVar15 + -1;
    local_70 = *(double *)(in_FS_OFFSET[-0xd] + lVar15 * 8);
  }
  return local_70;
}

Assistant:

double eval_ast(Environment& env, const Expr::AST& ast,
        const std::vector<double>& arg_vals) {
    // Main AST evaluation stack
    thread_local std::vector<double> stk;
    // Stack of thunks available:
    // contains positions of thunk_jmp encountered
    thread_local std::vector<size_t> thunks;
    // Thunk call stack: contains positions to return to
    // after reaching thunk_ret
    thread_local std::vector<size_t> thunks_stk;

    // Max function call stack height
    static const size_t MAX_CALL_STK_HEIGHT = 256;
    // Curr function call stack height
    thread_local size_t call_stk_height = 0;

    thread_local size_t top = -1;
    size_t init_top = top;

    // Make sure there is enough space
    stk.resize(top + ast.size() + 1);

#ifdef ENABLE_NIVALIS_BOOST_MATH
    using namespace boost;
    using namespace boost::math;
#endif
    using namespace nivalis::OpCode;

    bool _is_thunk_ret = false;

    // Shorthands for first, 2nd, 3rd arguments to operator
#define ARG3 stk[top-2]
#define ARG2 stk[top-1]
#define ARG1 stk[top]
// Return value from thunk or func call
#define RET_VAL stk[top+1]
// Quit without messing up stack
#define FAIL_AND_QUIT do {top = init_top; return NONE; } while(0)

    for (size_t cidx = ast.size() - 1; ~cidx; --cidx) {
        const auto& node = ast[cidx];
        switch(node.opcode) {
            case null: stk[++top] = NONE; break;
            case val:
                stk[++top] = node.val;  break;
            case ref:
                stk[++top] = env.vars[node.ref]; break;
            case arg:
                stk[++top] = arg_vals[node.ref]; break;
            case thunk_jmp:
                thunks.push_back(cidx);
                cidx -= ast[cidx].ref;
                break;
            case thunk_ret:
                cidx = thunks_stk.back() + 1;
                thunks_stk.pop_back();
                _is_thunk_ret = true;
                break;
            case call:
                {
                    size_t n_args = node.call_info[1];
                    auto& func = env.funcs[node.call_info[0]];
                    std::vector<double> f_args(n_args);
                    for (size_t i = 0; i < n_args; ++i) {
                        f_args[i] = stk[top--];
                    }
                    if (n_args != func.n_args ||               // Should not happen
                        &func.expr.ast[0] == &ast[0] ||        // Disallow recursion
                        call_stk_height > MAX_CALL_STK_HEIGHT) // Too many nested calls
                            FAIL_AND_QUIT;
                    ++call_stk_height;
                    eval_ast(env, func.expr.ast, f_args);
                    --call_stk_height;
                    ++top;
                }
                break;
            case bnz:
                if (_is_thunk_ret) {
                    --top; _is_thunk_ret = false;
                    ARG1 = RET_VAL;
                } else {
                    thunks_stk.push_back(cidx);
                    cidx = thunks[thunks.size() - (ARG1 == 0.) - 1];
                    thunks.resize(thunks.size() - 2);
                }
                break;

            case sums: case prods:
                {
                    if (_is_thunk_ret) {
                        --top; _is_thunk_ret = false;
                        // update arg3 (the output)
                        if (node.opcode == prods)
                            ARG3 *= RET_VAL;
                        else
                            ARG3 += RET_VAL; // arg3 is output
                    } else {
                        // Move over the arguments and use arg3
                        // as output
                        ++top; ARG1 = ARG2; ARG2 = ARG3;
                        ARG3 = node.opcode == prods ? 1. : 0.;
                    }
                    uint64_t var_id = node.ref;
                    int64_t a = static_cast<int64_t>(ARG1),
                            b = static_cast<int64_t>(ARG2);
                    int64_t step = (a <= b) ? 1 : -1;
                    if (std::isnan(ARG1)) {
                        top -= 2; thunks.pop_back();
                    } else {
                        env.vars[var_id] = static_cast<double>(a);
                        a += step;
                        if (a == b + step) ARG1 = NONE;
                        else ARG1 = static_cast<double>(a);
                        thunks_stk.push_back(cidx);
                        cidx = thunks.back();
                    }
                }
                break;

            case bsel: --top; break;
            case add: ARG2 += ARG1; --top; break;
            case sub: ARG2 = ARG1 - ARG2; --top; break;
            case mul: ARG2 *= ARG1;  --top; break;
            case divi: ARG2 = ARG1 / ARG2; --top; break;
            case mod: ARG2 = std::fmod(ARG1, ARG2); --top; break;
            case power: ARG2 = std::pow(ARG1, ARG2); --top; break;
            case logbase: ARG2 = log(ARG1) / log(ARG2); --top; break;
            case max: ARG2 = std::max(ARG1, ARG2); --top; break;
            case min: ARG2 = std::min(ARG1, ARG2); --top; break;
            case land: ARG2 = static_cast<double>(ARG1 && ARG2); --top; break;
            case lor: ARG2 = static_cast<double>(ARG1 || ARG2); --top; break;
            case lxor: ARG2 = static_cast<double>(
                               (ARG1 != 0.) ^ (ARG2 != 0.)); --top; break;
            case gcd: ARG2 = static_cast<double>(
                              std::gcd((int64_t) ARG1,
                                       (int64_t) ARG2)); --top; break;
            case lcm: ARG2 = ARG1 * ARG2 /
                      static_cast<double>(std::gcd(
                          (int64_t) ARG1, (int64_t) ARG2)); --top; break;
#ifdef ENABLE_NIVALIS_BOOST_MATH
            case choose: ARG2 = binomial_coefficient<double>(
                            (uint32_t)ARG1, (uint32_t)ARG2); --top; break;
            case fafact: ARG2 = falling_factorial<double>(
                            (uint32_t)ARG1, (uint32_t)ARG2); --top; break;
            case rifact: ARG2 = rising_factorial<double>(
                            (uint32_t)ARG1, (uint32_t)ARG2); --top; break;
            case betab: ARG2 = beta<double>(ARG1, ARG2); --top; break;
            case polygammab:
                        ARG2 = polygamma<double>((int)ARG1, ARG2); --top;
                        break;
#else
            case choose: {
                             double ad = std::round(ARG1);
                             double bd = std::round(ARG2);
                             if (ad < 0 || bd < 0) {
                                 ARG2 = std::numeric_limits<double>::quiet_NaN(); --top; break;
                             }
                             size_t a = static_cast<size_t>(ad), b = static_cast<size_t>(bd);
                             b = std::min(b, a-b);
                             ARG2 = fa_fact(a, a-b) / fa_fact(b);
                             --top; break;
                         }
            case fafact: {
                             double ad = std::round(ARG1);
                             double bd = std::round(ARG2);
                             if (ad < 0 || bd < 0) {
                                 ARG2 = std::numeric_limits<double>::quiet_NaN(); --top; break;
                             }
                             size_t a = static_cast<size_t>(ad), b = static_cast<size_t>(bd);
                             ARG2 = fa_fact(a, a-b);
                             --top; break;
                         }
            case rifact: {
                             double ad = std::round(ARG1);
                             double bd = std::round(ARG2);
                             if (ad < 0 || bd < 0) {
                                 ARG2 = std::numeric_limits<double>::quiet_NaN(); --top; break;
                             }
                             size_t a = static_cast<size_t>(ad), b = static_cast<size_t>(bd);
                             ARG2 = fa_fact(a+b-1, a-1);
                             --top; break;
                         }
            case betab: case polygammab:
                ARG1 = NONE; print_boost_warning(node.opcode); break;
#endif
            case lt: ARG2 = static_cast<double>(ARG1 < ARG2); --top; break;
            case le: ARG2 = static_cast<double>(ARG1 <= ARG2); --top; break;
            case eq: ARG2 = static_cast<double>(ARG1 == ARG2); --top; break;
            case ne: ARG2 = static_cast<double>(ARG1 != ARG2); --top; break;
            case ge: ARG2 = static_cast<double>(ARG1 >= ARG2); --top; break;
            case gt: ARG2 = static_cast<double>(ARG1 > ARG2); --top; break;

            case unaryminus: ARG1 = -ARG1; break;
            case lnot: ARG1 = static_cast<double>(!(ARG1)); break;
            case absb: ARG1 = std::fabs(ARG1); break;
            case sqrtb: ARG1 = std::sqrt(ARG1); break;
            case sqrb: ARG1 *= ARG1; break;
            case sgn: ARG1 = ARG1 > 0 ? 1 : (ARG1 == 0 ? 0 : -1); break;
            case floorb: ARG1 = floor(ARG1); break;
            case ceilb: ARG1 = ceil(ARG1); break; case roundb: ARG1 = round(ARG1); break;

            case expb:   ARG1 = exp(ARG1); break; case exp2b: ARG1 = exp2(ARG1); break;
            case logb:   ARG1 = log(ARG1); break;
            case factb:
                        {
                            unsigned n = static_cast<unsigned>(std::max(
                                        ARG1, 0.));
#ifdef ENABLE_NIVALIS_BOOST_MATH
                            ARG1 = factorial<double>(n);
#else
                            ARG1 = fa_fact(n, 1);
#endif
                        }
                        break;
            case log2b: ARG1 = log2(ARG1); break;  case log10b: ARG1 = log10(ARG1); break;
            case sinb: ARG1 = sin(ARG1); break;   case cosb:   ARG1 = cos(ARG1); break;
            case tanb: ARG1 = tan(ARG1); break;   case asinb: ARG1 = asin(ARG1); break;
            case acosb: ARG1 = acos(ARG1); break;  case atanb: ARG1 = atan(ARG1); break;
            case sinhb: ARG1 = sinh(ARG1); break;  case coshb: ARG1 = cosh(ARG1); break;
            case tanhb: ARG1 = tanh(ARG1); break;
            case tgammab: ARG1 = std::tgamma(ARG1); break;
            case lgammab: ARG1 = std::lgamma(ARG1); break;
#ifdef ENABLE_NIVALIS_BOOST_MATH
            case digammab: ARG1 = digamma<double>(ARG1); break;
            case trigammab: ARG1 = trigamma<double>(ARG1); break;
            case zetab: ARG1 = zeta<double>(ARG1); break;
#else
           // The following functions are unavailable without Boost
            case digammab: case trigammab: case zetab:
                ARG1 = NONE; print_boost_warning(node.opcode); break;
#endif
            case erfb: ARG1 = erf(ARG1); break;
            case sigmoidb: ARG1 = 1.f / (1.f + exp(-ARG1)); break;
            case softplusb: {
                                if (ARG1 < 15.f) {
                                    ARG1 = log(1.f + exp(ARG1));
                                }
                            }
                            break;
            case gausspdfb: ARG1 = 1.f / sqrt(M_PI * 2.f) * exp(-pow(ARG1, 2.f) * 0.5f); break;
        }
    }
    return stk[top--];
}